

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::prepareGetActual
          (Calendar *this,UCalendarDateFields field,UBool isMinimum,UErrorCode *status)

{
  int32_t value;
  int iVar1;
  UCalendarDaysOfWeek local_24;
  int32_t dow;
  UErrorCode *status_local;
  UBool isMinimum_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  set(this,UCAL_MILLISECONDS_IN_DAY,0);
  switch(field) {
  case UCAL_YEAR:
  case UCAL_EXTENDED_YEAR:
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])(this,6);
    set(this,UCAL_DAY_OF_YEAR,iVar1);
    break;
  case UCAL_WEEK_OF_YEAR:
  case UCAL_WEEK_OF_MONTH:
    local_24 = this->fFirstDayOfWeek;
    if ((isMinimum != '\0') && (local_24 = (int)(local_24 + UCAL_FRIDAY) % 7, (int)local_24 < 1)) {
      local_24 = local_24 + UCAL_SATURDAY;
    }
    set(this,UCAL_DAY_OF_WEEK,local_24);
    break;
  default:
    break;
  case UCAL_DAY_OF_WEEK_IN_MONTH:
    set(this,UCAL_DATE,1);
    value = get(this,UCAL_DAY_OF_WEEK,status);
    set(this,UCAL_DAY_OF_WEEK,value);
    break;
  case UCAL_YEAR_WOY:
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])(this,3);
    set(this,UCAL_WEEK_OF_YEAR,iVar1);
  case UCAL_MONTH:
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])(this,5);
    set(this,UCAL_DATE,iVar1);
  }
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x12])(this,(ulong)field);
  set(this,field,iVar1);
  return;
}

Assistant:

void Calendar::prepareGetActual(UCalendarDateFields field, UBool isMinimum, UErrorCode &status)
{
    set(UCAL_MILLISECONDS_IN_DAY, 0);

    switch (field) {
    case UCAL_YEAR:
    case UCAL_EXTENDED_YEAR:
        set(UCAL_DAY_OF_YEAR, getGreatestMinimum(UCAL_DAY_OF_YEAR));
        break;

    case UCAL_YEAR_WOY:
        set(UCAL_WEEK_OF_YEAR, getGreatestMinimum(UCAL_WEEK_OF_YEAR));
        U_FALLTHROUGH;
    case UCAL_MONTH:
        set(UCAL_DATE, getGreatestMinimum(UCAL_DATE));
        break;

    case UCAL_DAY_OF_WEEK_IN_MONTH:
        // For dowim, the maximum occurs for the DOW of the first of the
        // month.
        set(UCAL_DATE, 1);
        set(UCAL_DAY_OF_WEEK, get(UCAL_DAY_OF_WEEK, status)); // Make this user set
        break;

    case UCAL_WEEK_OF_MONTH:
    case UCAL_WEEK_OF_YEAR:
        // If we're counting weeks, set the day of the week to either the
        // first or last localized DOW.  We know the last week of a month
        // or year will contain the first day of the week, and that the
        // first week will contain the last DOW.
        {
            int32_t dow = fFirstDayOfWeek;
            if (isMinimum) {
                dow = (dow + 6) % 7; // set to last DOW
                if (dow < UCAL_SUNDAY) {
                    dow += 7;
                }
            }
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "prepareGetActualHelper(WOM/WOY) - dow=%d\n", dow);
#endif
            set(UCAL_DAY_OF_WEEK, dow);
        }
        break;
    default:
        break;
    }

    // Do this last to give it the newest time stamp
    set(field, getGreatestMinimum(field));
}